

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  long *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar54;
  undefined8 uVar61;
  int *piVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined1 auVar72 [16];
  vector<float,_std::allocator<float>_> *pvVar73;
  Option *pOVar74;
  int *piVar75;
  uint uVar76;
  int iVar77;
  undefined4 extraout_var;
  byte bVar78;
  int iVar79;
  int iVar80;
  Layer *pLVar81;
  Option *opt_00;
  int iVar82;
  ConvolutionDepthWise_x86 *pCVar83;
  uint uVar84;
  int iVar85;
  size_t totalsize;
  ulong uVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  bool bVar90;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_int8;
  void *ptr;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  Allocator *pAStack_1a8;
  int local_1a0;
  undefined4 uStack_19c;
  Allocator *local_198;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  int iStack_184;
  size_t sStack_180;
  Option *local_170;
  Option opt_g;
  undefined1 local_118 [40];
  undefined1 local_f0 [16];
  size_t local_e0;
  int local_d0;
  uint local_cc;
  Option opt_g_1;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined3 uVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined3 uVar18;
  undefined1 uVar19;
  undefined2 uVar20;
  undefined1 uVar21;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined3 uVar26;
  undefined1 uVar27;
  undefined2 uVar28;
  undefined1 uVar29;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined3 uVar34;
  undefined1 uVar35;
  undefined2 uVar36;
  undefined1 uVar37;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined3 uVar42;
  undefined1 uVar43;
  undefined2 uVar44;
  undefined1 uVar45;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined3 uVar50;
  undefined1 uVar51;
  undefined2 uVar52;
  undefined1 uVar53;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined3 uVar57;
  undefined1 uVar58;
  undefined2 uVar59;
  undefined1 uVar60;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined3 uVar64;
  undefined1 uVar65;
  undefined2 uVar66;
  undefined1 uVar67;
  
  iVar80 = bottom_blob->c;
  p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if (iVar80 % *(int *)(&this->field_0xb8 + (long)p_Var3) != 0) {
    return -100;
  }
  if (*(int *)(&this->field_0x80 + (long)p_Var3) % *(int *)(&this->field_0xb8 + (long)p_Var3) != 0)
  {
    return -100;
  }
  iVar79 = bottom_blob->w;
  iVar85 = bottom_blob->h;
  opt_00 = (Option *)bottom_blob->elemsize;
  uVar76 = (*(int *)(&this->field_0x84 + (long)p_Var3) + -1) *
           *(int *)(&this->field_0x8c + (long)p_Var3);
  uVar84 = (*(int *)(&this->field_0x88 + (long)p_Var3) + -1) *
           *(int *)(&this->field_0x90 + (long)p_Var3);
  local_118._0_8_ = bottom_blob->data;
  local_118._8_8_ = bottom_blob->refcount;
  local_118._24_4_ = bottom_blob->elempack;
  local_118._32_8_ = bottom_blob->allocator;
  uVar69 = bottom_blob->dims;
  uVar70 = bottom_blob->w;
  uVar71 = bottom_blob->h;
  local_f0._8_4_ = uVar71;
  local_f0._4_4_ = uVar70;
  local_f0._0_4_ = uVar69;
  local_f0._12_4_ = iVar80;
  local_e0 = bottom_blob->cstep;
  if ((int *)local_118._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + 1;
    UNLOCK();
  }
  bVar78 = opt_00 != (Option *)0x1 &
           (&this->field_0x20c)[(long)this->_vptr_ConvolutionDepthWise_x86[-3]];
  local_170 = opt;
  local_118._16_8_ = opt_00;
  bottom_blob_int8.refcount = (int *)local_118._8_8_;
  if (bVar78 == 1) {
    bottom_blob_int8.allocator = opt->workspace_allocator;
    auVar72._4_4_ = -(uint)(iVar85 == 0);
    auVar72._0_4_ = -(uint)(iVar79 == 0);
    auVar72._8_4_ = -(uint)(iVar80 == 0);
    auVar72._12_4_ = 0;
    movmskps((int)CONCAT71((int7)(local_e0 >> 8),bVar78),auVar72 << 0x20);
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.elemsize._0_4_ = 1;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 1;
    bottom_blob_int8.w = iVar79;
    bottom_blob_int8.dims = 3;
    bottom_blob_int8.h = iVar85;
    bottom_blob_int8.c = iVar80;
    bottom_blob_int8.cstep = (long)(iVar85 * iVar79) + 0xfU & 0xfffffffffffffff0;
    uVar86 = bottom_blob_int8.cstep * (long)iVar80;
    local_cc = uVar84;
    if (uVar86 != 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        ptr = (void *)0x0;
        iVar77 = posix_memalign(&ptr,0x10,uVar86 | 4);
        bottom_blob_int8.data = ptr;
        if (iVar77 != 0) {
          ptr = (void *)0x0;
          bottom_blob_int8.data = ptr;
        }
      }
      else {
        iVar77 = (*(bottom_blob_int8.allocator)->_vptr_Allocator[2])
                           (bottom_blob_int8.allocator,uVar86 | 4);
        bottom_blob_int8.data = (void *)CONCAT44(extraout_var,iVar77);
      }
      bottom_blob_int8.refcount = (int *)((long)bottom_blob_int8.data + uVar86);
      *(undefined4 *)((long)bottom_blob_int8.data + uVar86) = 1;
    }
    if (bottom_blob_int8.data == (void *)0x0) {
      bVar90 = true;
    }
    else {
      bVar90 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    }
    if (bVar90) {
      if (bottom_blob_int8.refcount != (int *)0x0) {
        LOCK();
        *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
        UNLOCK();
        if (*bottom_blob_int8.refcount == 0) {
          if (bottom_blob_int8.allocator == (Allocator *)0x0) {
            if (bottom_blob_int8.data != (void *)0x0) {
              free(bottom_blob_int8.data);
            }
          }
          else {
            (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar77 = -100;
      goto LAB_0015ee5c;
    }
    pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
    iVar77 = iVar80 / *(int *)(&this->field_0xb8 + (long)pp_Var4[-3]);
    local_d0 = iVar80;
    if (0 < *(int *)(&this->field_0xb8 + (long)pp_Var4[-3])) {
      lVar87 = 0;
      lVar88 = 0;
      do {
        uVar6._0_1_ = local_170->lightmode;
        uVar6._1_3_ = *(undefined3 *)&local_170->field_0x1;
        uVar6._4_4_ = local_170->num_threads;
        opt_g.workspace_allocator = local_170->workspace_allocator;
        uVar7._0_1_ = local_170->use_winograd_convolution;
        uVar7._1_1_ = local_170->use_sgemm_convolution;
        uVar7._2_1_ = local_170->use_int8_inference;
        uVar7._3_1_ = local_170->use_vulkan_compute;
        uVar8 = local_170->use_fp16_packed;
        uVar9 = local_170->use_fp16_storage;
        uVar11 = local_170->use_fp16_arithmetic;
        uVar13 = local_170->use_int8_storage;
        uVar12 = CONCAT11(uVar13,uVar11);
        uVar10 = CONCAT21(uVar12,uVar9);
        uVar7._4_4_ = CONCAT31(uVar10,uVar8);
        opt_g._0_4_ = SUB84(uVar6,0);
        opt_g.use_int8_arithmetic = local_170->use_int8_arithmetic;
        opt_g.use_packing_layout = local_170->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&local_170->field_0x22;
        opt_g._24_4_ = SUB84(uVar7,0);
        opt_g.num_threads = 1;
        opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8.allocator,0);
        opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
        iStack_18c = bottom_blob->w;
        iStack_188 = bottom_blob->h;
        pAStack_1a8 = (Allocator *)bottom_blob->elemsize;
        ptr = (void *)(bottom_blob->cstep * lVar87 * (long)pAStack_1a8 + (long)bottom_blob->data);
        local_1a0 = bottom_blob->elempack;
        local_198 = bottom_blob->allocator;
        uStack_1b0 = 0;
        uStack_1ac = 0;
        iStack_190 = 3;
        sStack_180 = ((long)(iStack_188 * iStack_18c) * (long)pAStack_1a8 + 0xfU &
                     0xfffffffffffffff0) / (ulong)pAStack_1a8;
        bottom_blob_int8_g.elemsize =
             CONCAT44(bottom_blob_int8.elemsize._4_4_,(undefined4)bottom_blob_int8.elemsize);
        bottom_blob_int8_g.data =
             (void *)(bottom_blob_int8.cstep * lVar87 * bottom_blob_int8_g.elemsize +
                     (long)bottom_blob_int8.data);
        bottom_blob_int8_g.refcount._0_4_ = 0;
        bottom_blob_int8_g.refcount._4_4_ = 0;
        bottom_blob_int8_g.elempack = bottom_blob_int8.elempack;
        bottom_blob_int8_g.allocator = bottom_blob_int8.allocator;
        bottom_blob_int8_g.w = bottom_blob_int8.w;
        bottom_blob_int8_g.dims = 3;
        bottom_blob_int8_g.h = bottom_blob_int8.h;
        bottom_blob_int8_g.c = iVar77;
        bottom_blob_int8_g.cstep =
             ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * bottom_blob_int8_g.elemsize + 0xf &
             0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
        plVar5 = *(long **)(*(long *)(&this->field_0x210 + (long)pp_Var4[-3]) + lVar88 * 8);
        iStack_184 = iVar77;
        opt_g._28_4_ = uVar7._4_4_;
        (**(code **)(*plVar5 + 0x38))(plVar5,&ptr,&bottom_blob_int8_g,&opt_g);
        piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                  bottom_blob_int8_g.refcount._0_4_);
        if (piVar68 != (int *)0x0) {
          LOCK();
          *piVar68 = *piVar68 + -1;
          UNLOCK();
          if (*piVar68 == 0) {
            if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
              if (bottom_blob_int8_g.data != (void *)0x0) {
                free(bottom_blob_int8_g.data);
              }
            }
            else {
              (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob_int8_g.elemsize = 0;
        bottom_blob_int8_g.elempack = 0;
        bottom_blob_int8_g.data = (void *)0x0;
        bottom_blob_int8_g.refcount._0_4_ = 0;
        bottom_blob_int8_g.refcount._4_4_ = 0;
        bottom_blob_int8_g.dims = 0;
        bottom_blob_int8_g.w = 0;
        bottom_blob_int8_g.h = 0;
        bottom_blob_int8_g.c = 0;
        bottom_blob_int8_g.cstep = 0;
        piVar68 = (int *)CONCAT44(uStack_1ac,uStack_1b0);
        if (piVar68 != (int *)0x0) {
          LOCK();
          *piVar68 = *piVar68 + -1;
          UNLOCK();
          if (*piVar68 == 0) {
            if (local_198 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (*local_198->_vptr_Allocator[3])();
            }
          }
        }
        pAStack_1a8 = (Allocator *)0x0;
        local_1a0 = 0;
        ptr = (void *)0x0;
        uStack_1b0 = 0;
        uStack_1ac = 0;
        iStack_190 = 0;
        iStack_18c = 0;
        iStack_188 = 0;
        iStack_184 = 0;
        sStack_180 = 0;
        lVar88 = lVar88 + 1;
        pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
        lVar87 = lVar87 + iVar77;
      } while (lVar88 < *(int *)(&this->field_0xb8 + (long)pp_Var4[-3]));
    }
    uVar84 = local_cc;
    opt = local_170;
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
      UNLOCK();
    }
    if ((int *)local_118._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_118._8_8_ == 0) {
        if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
          if ((void *)local_118._0_8_ != (void *)0x0) {
            free((void *)local_118._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_118._32_8_)[3])();
        }
      }
    }
    iVar80 = local_d0;
    local_118._0_8_ = bottom_blob_int8.data;
    local_118._16_8_ =
         CONCAT44(bottom_blob_int8.elemsize._4_4_,(undefined4)bottom_blob_int8.elemsize);
    local_118._24_4_ = bottom_blob_int8.elempack;
    local_118._32_8_ = bottom_blob_int8.allocator;
    local_f0._0_4_ = bottom_blob_int8.dims;
    local_f0._4_4_ = bottom_blob_int8.w;
    local_f0._8_4_ = bottom_blob_int8.h;
    local_f0._12_4_ = bottom_blob_int8.c;
    local_e0 = bottom_blob_int8.cstep;
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
      UNLOCK();
      if (*bottom_blob_int8.refcount == 0) {
        local_118._8_8_ = bottom_blob_int8.refcount;
        if (bottom_blob_int8.allocator == (Allocator *)0x0) {
          if (bottom_blob_int8.data != (void *)0x0) {
            free(bottom_blob_int8.data);
            bottom_blob_int8.refcount = (int *)local_118._8_8_;
          }
        }
        else {
          (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
          bottom_blob_int8.refcount = (int *)local_118._8_8_;
        }
      }
    }
    iVar77 = -100;
    local_118._8_8_ = bottom_blob_int8.refcount;
    if (bVar90) goto LAB_0015ee5c;
  }
  bottom_blob_int8.data = (void *)local_118._0_8_;
  bottom_blob_int8.elemsize._0_4_ = (undefined4)local_118._16_8_;
  bottom_blob_int8.elemsize._4_4_ = SUB84(local_118._16_8_,4);
  bottom_blob_int8.elempack = local_118._24_4_;
  bottom_blob_int8.allocator = (Allocator *)local_118._32_8_;
  bottom_blob_int8.dims = local_f0._0_4_;
  bottom_blob_int8.w = local_f0._4_4_;
  bottom_blob_int8.h = local_f0._8_4_;
  bottom_blob_int8.c = local_f0._12_4_;
  bottom_blob_int8.cstep = local_e0;
  if (bottom_blob_int8.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
    UNLOCK();
  }
  pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var3 = pp_Var4[-3];
  iVar77 = *(int *)(&this->field_0x9c + (long)p_Var3);
  local_118._8_8_ = bottom_blob_int8.refcount;
  if ((((iVar77 < 1) && (iVar82 = *(int *)(&this->field_0xa0 + (long)p_Var3), iVar82 < 1)) &&
      (iVar1 = *(int *)(&this->field_0xa4 + (long)p_Var3), iVar1 < 1)) &&
     (iVar2 = *(int *)(&this->field_0xa8 + (long)p_Var3), iVar2 < 1)) {
    piVar68 = bottom_blob_int8.refcount;
    if (((iVar77 == -0xe9) && (iVar82 == -0xe9)) && ((iVar1 == -0xe9 && (iVar2 == -0xe9)))) {
      iVar82 = uVar76 - (iVar79 + -1) % *(int *)(&this->field_0x94 + (long)p_Var3);
      iVar77 = uVar84 - (iVar85 + -1) % *(int *)(&this->field_0x98 + (long)p_Var3);
      if ((iVar82 < 1) && (iVar77 < 1)) goto LAB_0015efd4;
      local_198 = *(Allocator **)&opt->use_int8_arithmetic;
      ptr = *(void **)opt;
      pAStack_1a8 = opt->workspace_allocator;
      uVar54._0_1_ = opt->use_winograd_convolution;
      uVar54._1_1_ = opt->use_sgemm_convolution;
      uVar54._2_1_ = opt->use_int8_inference;
      uVar54._3_1_ = opt->use_vulkan_compute;
      uVar55 = opt->use_fp16_packed;
      uVar56 = opt->use_fp16_storage;
      uVar58 = opt->use_fp16_arithmetic;
      uVar60 = opt->use_int8_storage;
      uVar59 = CONCAT11(uVar60,uVar58);
      uVar57 = CONCAT21(uVar59,uVar56);
      uVar54._4_4_ = CONCAT31(uVar57,uVar55);
      local_1a0 = (int)uVar54;
      uStack_1b0 = SUB84(opt->workspace_allocator,0);
      uStack_1ac = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      uStack_19c = uVar54._4_4_;
      copy_make_border((Mat *)local_118,&bottom_blob_int8,iVar77 / 2,iVar77 - iVar77 / 2,iVar82 / 2,
                       iVar82 - iVar82 / 2,0,*(float *)(&this->field_0xac + (long)pp_Var4[-3]),
                       (Option *)&ptr);
      piVar75 = (int *)local_118._8_8_;
      piVar68 = bottom_blob_int8.refcount;
LAB_0015efaa:
      bottom_blob_int8.refcount = piVar75;
      if (bottom_blob_int8.data == (void *)0x0) {
        bVar90 = false;
      }
      else {
        if ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0) goto LAB_0015efd4;
        bVar90 = false;
      }
    }
    else {
      if (((iVar77 != -0xea) || (iVar82 != -0xea)) || ((iVar1 != -0xea || (iVar2 != -0xea))))
      goto LAB_0015db6c;
      iVar82 = uVar76 - (iVar79 + -1) % *(int *)(&this->field_0x94 + (long)p_Var3);
      iVar77 = uVar84 - (iVar85 + -1) % *(int *)(&this->field_0x98 + (long)p_Var3);
      if ((0 < iVar82) || (0 < iVar77)) {
        local_198 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        pAStack_1a8 = opt->workspace_allocator;
        uVar61._0_1_ = opt->use_winograd_convolution;
        uVar61._1_1_ = opt->use_sgemm_convolution;
        uVar61._2_1_ = opt->use_int8_inference;
        uVar61._3_1_ = opt->use_vulkan_compute;
        uVar62 = opt->use_fp16_packed;
        uVar63 = opt->use_fp16_storage;
        uVar65 = opt->use_fp16_arithmetic;
        uVar67 = opt->use_int8_storage;
        uVar66 = CONCAT11(uVar67,uVar65);
        uVar64 = CONCAT21(uVar66,uVar63);
        uVar61._4_4_ = CONCAT31(uVar64,uVar62);
        local_1a0 = (int)uVar61;
        uStack_1b0 = SUB84(opt->workspace_allocator,0);
        uStack_1ac = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        uStack_19c = uVar61._4_4_;
        copy_make_border((Mat *)local_118,&bottom_blob_int8,iVar77 - iVar77 / 2,iVar77 / 2,
                         iVar82 - iVar82 / 2,iVar82 / 2,0,
                         *(float *)(&this->field_0xac + (long)pp_Var4[-3]),(Option *)&ptr);
        piVar75 = (int *)local_118._8_8_;
        piVar68 = bottom_blob_int8.refcount;
        goto LAB_0015efaa;
      }
LAB_0015efd4:
      bVar90 = true;
      iVar79 = bottom_blob_int8.w;
      iVar85 = bottom_blob_int8.h;
    }
    iVar77 = -100;
    local_118._8_8_ = bottom_blob_int8.refcount;
    bottom_blob_int8.refcount = piVar68;
    if (bVar90) {
LAB_0015db6c:
      pOVar74 = local_170;
      p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
      iVar79 = (int)(~uVar76 + iVar79) / *(int *)(&this->field_0x94 + (long)p_Var3) + 1;
      iVar85 = (int)(~uVar84 + iVar85) / *(int *)(&this->field_0x98 + (long)p_Var3) + 1;
      if ((&this->field_0x20c)[(long)p_Var3] == '\x01') {
        if ((&this->field_0x20d)[(long)p_Var3] == '\x01') {
          pAStack_1a8 = (Allocator *)0x0;
          local_1a0 = 0;
          ptr = (void *)0x0;
          uStack_1b0 = 0;
          uStack_1ac = 0;
          local_198 = (Allocator *)0x0;
          iStack_190 = 0;
          iStack_18c = 0;
          iStack_188 = 0;
          iStack_184 = 0;
          sStack_180 = 0;
          Mat::create((Mat *)&ptr,iVar79,iVar85,
                      *(int *)(&this->field_0x80 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]),4
                      ,local_170->workspace_allocator);
          iVar77 = -100;
          if ((ptr == (void *)0x0) || ((long)iStack_184 * sStack_180 == 0)) {
LAB_0015dfb4:
            bVar90 = false;
          }
          else {
            Mat::create(top_blob,iVar79,iVar85,
                        *(int *)(&this->field_0x80 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                        ,1,pOVar74->blob_allocator);
            if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
            goto LAB_0015dfb4;
            p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
            iVar79 = *(int *)(&this->field_0xb8 + (long)p_Var3);
            if ((iVar80 == iVar79) && (iVar79 == *(int *)(&this->field_0x80 + (long)p_Var3))) {
              if (((((*(int *)(&this->field_0x84 + (long)p_Var3) == 3) &&
                    (*(int *)(&this->field_0x88 + (long)p_Var3) == 3)) &&
                   (*(int *)(&this->field_0x8c + (long)p_Var3) == 1)) &&
                  (*(int *)(&this->field_0x90 + (long)p_Var3) == 1)) &&
                 (((iVar80 = *(int *)(&this->field_0x94 + (long)p_Var3), iVar80 == 1 &&
                   (*(int *)(&this->field_0x98 + (long)p_Var3) == 1)) ||
                  ((iVar80 == 2 && (*(int *)(&this->field_0x98 + (long)p_Var3) == 2)))))) {
                if ((iVar80 == 1) && (*(int *)(&this->field_0x98 + (long)p_Var3) == 1)) {
                  pCVar83 = this;
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_48,
                             (vector<float,_std::allocator<float>_> *)
                             (&this->field_0x270 + (long)p_Var3));
                  convdw3x3s1_int8_requant_sse
                            (&bottom_blob_int8,top_blob,(Mat *)(&this->field_0x108 + (long)p_Var3),
                             (Mat *)(&this->field_0x148 + (long)p_Var3),&local_48,(Option *)pCVar83)
                  ;
                  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    pvVar73 = &local_48;
LAB_0015f3e9:
                    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)(pvVar73->
                                          super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                          .super__Vector_impl_data._M_end_of_storage -
                                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                else if ((iVar80 == 2) && (*(int *)(&this->field_0x98 + (long)p_Var3) == 2)) {
                  pCVar83 = this;
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_60,
                             (vector<float,_std::allocator<float>_> *)
                             (&this->field_0x270 + (long)p_Var3));
                  convdw3x3s2_int8_requant_sse
                            (&bottom_blob_int8,top_blob,(Mat *)(&this->field_0x108 + (long)p_Var3),
                             (Mat *)(&this->field_0x148 + (long)p_Var3),&local_60,(Option *)pCVar83)
                  ;
                  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    pvVar73 = &local_60;
                    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    goto LAB_0015f3e9;
                  }
                }
                pLVar81 = this->activation;
              }
              else {
                if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                   ) {
                  lVar87 = 0;
                  do {
                    bottom_blob_int8_g.elemsize =
                         CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                  (undefined4)bottom_blob_int8.elemsize);
                    bottom_blob_int8_g.data =
                         (void *)(bottom_blob_int8.cstep * lVar87 * bottom_blob_int8_g.elemsize +
                                 (long)bottom_blob_int8.data);
                    bottom_blob_int8_g.refcount._0_4_ = 0;
                    bottom_blob_int8_g.refcount._4_4_ = 0;
                    bottom_blob_int8_g.elempack = bottom_blob_int8.elempack;
                    bottom_blob_int8_g.allocator = bottom_blob_int8.allocator;
                    bottom_blob_int8_g.w = bottom_blob_int8.w;
                    bottom_blob_int8_g.dims = 3;
                    bottom_blob_int8_g.h = bottom_blob_int8.h;
                    bottom_blob_int8_g.c = 1;
                    bottom_blob_int8_g.cstep =
                         ((long)(bottom_blob_int8.h * bottom_blob_int8.w) *
                          bottom_blob_int8_g.elemsize + 0xf & 0xfffffffffffffff0) /
                         bottom_blob_int8_g.elemsize;
                    opt_g._0_8_ = sStack_180 * lVar87 * (long)pAStack_1a8 + (long)ptr;
                    opt_g.blob_allocator._0_4_ = 0;
                    opt_g.blob_allocator._4_4_ = 0;
                    opt_g.workspace_allocator = pAStack_1a8;
                    opt_g.use_winograd_convolution = (bool)(undefined1)local_1a0;
                    opt_g.use_sgemm_convolution = (bool)local_1a0._1_1_;
                    opt_g.use_int8_inference = (bool)local_1a0._2_1_;
                    opt_g.use_vulkan_compute = (bool)local_1a0._3_1_;
                    opt_g._32_8_ = local_198;
                    pLVar81 = (this->group_ops).
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar87];
                    uVar46._0_1_ = local_170->lightmode;
                    uVar46._1_3_ = *(undefined3 *)&local_170->field_0x1;
                    uVar46._4_4_ = local_170->num_threads;
                    opt_g_1.workspace_allocator = local_170->workspace_allocator;
                    opt_g_1.use_winograd_convolution = local_170->use_winograd_convolution;
                    opt_g_1.use_sgemm_convolution = local_170->use_sgemm_convolution;
                    opt_g_1.use_int8_inference = local_170->use_int8_inference;
                    opt_g_1.use_vulkan_compute = local_170->use_vulkan_compute;
                    opt_g_1.use_fp16_packed = local_170->use_fp16_packed;
                    opt_g_1.use_fp16_storage = local_170->use_fp16_storage;
                    opt_g_1.use_fp16_arithmetic = local_170->use_fp16_arithmetic;
                    opt_g_1.use_int8_storage = local_170->use_int8_storage;
                    opt_g_1.use_int8_arithmetic = local_170->use_int8_arithmetic;
                    opt_g_1.use_packing_layout = local_170->use_packing_layout;
                    opt_g_1._34_6_ = *(undefined6 *)&local_170->field_0x22;
                    opt_g_1._0_4_ = SUB84(uVar46,0);
                    opt_g_1.num_threads = 1;
                    opt_g_1.blob_allocator = top_blob->allocator;
                    (*pLVar81->_vptr_Layer[7])(pLVar81,&bottom_blob_int8_g,&opt_g,&opt_g_1);
                    piVar68 = (int *)CONCAT44(opt_g.blob_allocator._4_4_,opt_g.blob_allocator._0_4_)
                    ;
                    if (piVar68 != (int *)0x0) {
                      LOCK();
                      *piVar68 = *piVar68 + -1;
                      UNLOCK();
                      if (*piVar68 == 0) {
                        if (opt_g._32_8_ == 0) {
                          if (opt_g._0_8_ != 0) {
                            free((void *)opt_g._0_8_);
                          }
                        }
                        else {
                          (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
                        }
                      }
                    }
                    opt_g.workspace_allocator = (Allocator *)0x0;
                    opt_g.use_winograd_convolution = false;
                    opt_g.use_sgemm_convolution = false;
                    opt_g.use_int8_inference = false;
                    opt_g.use_vulkan_compute = false;
                    opt_g.lightmode = false;
                    opt_g._1_3_ = 0;
                    opt_g.num_threads = 0;
                    opt_g.blob_allocator._0_4_ = 0;
                    opt_g.blob_allocator._4_4_ = 0;
                    piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                              bottom_blob_int8_g.refcount._0_4_);
                    if (piVar68 != (int *)0x0) {
                      LOCK();
                      *piVar68 = *piVar68 + -1;
                      UNLOCK();
                      if (*piVar68 == 0) {
                        if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                          if (bottom_blob_int8_g.data != (void *)0x0) {
                            free(bottom_blob_int8_g.data);
                          }
                        }
                        else {
                          (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    bottom_blob_int8_g.elemsize = 0;
                    bottom_blob_int8_g.elempack = 0;
                    bottom_blob_int8_g.data = (void *)0x0;
                    bottom_blob_int8_g.refcount._0_4_ = 0;
                    bottom_blob_int8_g.refcount._4_4_ = 0;
                    bottom_blob_int8_g.dims = 0;
                    bottom_blob_int8_g.w = 0;
                    bottom_blob_int8_g.h = 0;
                    bottom_blob_int8_g.c = 0;
                    bottom_blob_int8_g.cstep = 0;
                    lVar87 = lVar87 + 1;
                  } while (lVar87 < *(int *)(&this->field_0xb8 +
                                            (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
                }
                pLVar81 = this->activation;
              }
              if (pLVar81 == (Layer *)0x0) {
                bVar90 = false;
                iVar77 = 0;
              }
              else {
                bVar90 = false;
                (*pLVar81->_vptr_Layer[9])(pLVar81,top_blob,local_170);
                iVar77 = 0;
              }
            }
            else {
              iVar85 = *(int *)(&this->field_0x80 + (long)p_Var3);
              bVar90 = true;
              if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]))
              {
                lVar89 = 0;
                lVar88 = 0;
                lVar87 = 0;
                do {
                  bottom_blob_int8_g.elemsize =
                       CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                (undefined4)bottom_blob_int8.elemsize);
                  bottom_blob_int8_g.data =
                       (void *)(bottom_blob_int8.cstep * lVar89 * bottom_blob_int8_g.elemsize +
                               (long)bottom_blob_int8.data);
                  bottom_blob_int8_g.refcount._0_4_ = 0;
                  bottom_blob_int8_g.refcount._4_4_ = 0;
                  bottom_blob_int8_g.elempack = bottom_blob_int8.elempack;
                  bottom_blob_int8_g.allocator = bottom_blob_int8.allocator;
                  bottom_blob_int8_g.w = bottom_blob_int8.w;
                  bottom_blob_int8_g.dims = 3;
                  bottom_blob_int8_g.h = bottom_blob_int8.h;
                  bottom_blob_int8_g.c = iVar80 / iVar79;
                  bottom_blob_int8_g.cstep =
                       ((long)(bottom_blob_int8.h * bottom_blob_int8.w) *
                        bottom_blob_int8_g.elemsize + 0xf & 0xfffffffffffffff0) /
                       bottom_blob_int8_g.elemsize;
                  opt_g._0_8_ = sStack_180 * lVar88 * (long)pAStack_1a8 + (long)ptr;
                  opt_g.blob_allocator._0_4_ = 0;
                  opt_g.blob_allocator._4_4_ = 0;
                  opt_g.workspace_allocator = pAStack_1a8;
                  opt_g.use_winograd_convolution = (bool)(undefined1)local_1a0;
                  opt_g.use_sgemm_convolution = (bool)local_1a0._1_1_;
                  opt_g.use_int8_inference = (bool)local_1a0._2_1_;
                  opt_g.use_vulkan_compute = (bool)local_1a0._3_1_;
                  opt_g._32_8_ = local_198;
                  pLVar81 = (this->group_ops).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar87];
                  opt_g_1.use_int8_arithmetic = local_170->use_int8_arithmetic;
                  opt_g_1.use_packing_layout = local_170->use_packing_layout;
                  opt_g_1._34_6_ = *(undefined6 *)&local_170->field_0x22;
                  opt_g_1.lightmode = local_170->lightmode;
                  opt_g_1._1_3_ = *(undefined3 *)&local_170->field_0x1;
                  opt_g_1.num_threads = local_170->num_threads;
                  opt_g_1.workspace_allocator = local_170->workspace_allocator;
                  opt_g_1.use_winograd_convolution = local_170->use_winograd_convolution;
                  opt_g_1.use_sgemm_convolution = local_170->use_sgemm_convolution;
                  opt_g_1.use_int8_inference = local_170->use_int8_inference;
                  opt_g_1.use_vulkan_compute = local_170->use_vulkan_compute;
                  opt_g_1.use_fp16_packed = local_170->use_fp16_packed;
                  opt_g_1.use_fp16_storage = local_170->use_fp16_storage;
                  opt_g_1.use_fp16_arithmetic = local_170->use_fp16_arithmetic;
                  opt_g_1.use_int8_storage = local_170->use_int8_storage;
                  opt_g_1.blob_allocator = top_blob->allocator;
                  (*pLVar81->_vptr_Layer[7])(pLVar81,&bottom_blob_int8_g,&opt_g,&opt_g_1);
                  piVar68 = (int *)CONCAT44(opt_g.blob_allocator._4_4_,opt_g.blob_allocator._0_4_);
                  if (piVar68 != (int *)0x0) {
                    LOCK();
                    *piVar68 = *piVar68 + -1;
                    UNLOCK();
                    if (*piVar68 == 0) {
                      if (opt_g._32_8_ == 0) {
                        if (opt_g._0_8_ != 0) {
                          free((void *)opt_g._0_8_);
                        }
                      }
                      else {
                        (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
                      }
                    }
                  }
                  opt_g.workspace_allocator = (Allocator *)0x0;
                  opt_g.use_winograd_convolution = false;
                  opt_g.use_sgemm_convolution = false;
                  opt_g.use_int8_inference = false;
                  opt_g.use_vulkan_compute = false;
                  opt_g.lightmode = false;
                  opt_g._1_3_ = 0;
                  opt_g.num_threads = 0;
                  opt_g.blob_allocator._0_4_ = 0;
                  opt_g.blob_allocator._4_4_ = 0;
                  piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                            bottom_blob_int8_g.refcount._0_4_);
                  if (piVar68 != (int *)0x0) {
                    LOCK();
                    *piVar68 = *piVar68 + -1;
                    UNLOCK();
                    if (*piVar68 == 0) {
                      if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                        if (bottom_blob_int8_g.data != (void *)0x0) {
                          free(bottom_blob_int8_g.data);
                        }
                      }
                      else {
                        (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blob_int8_g.elemsize = 0;
                  bottom_blob_int8_g.elempack = 0;
                  bottom_blob_int8_g.data = (void *)0x0;
                  bottom_blob_int8_g.refcount._0_4_ = 0;
                  bottom_blob_int8_g.refcount._4_4_ = 0;
                  bottom_blob_int8_g.dims = 0;
                  bottom_blob_int8_g.w = 0;
                  bottom_blob_int8_g.h = 0;
                  bottom_blob_int8_g.c = 0;
                  bottom_blob_int8_g.cstep = 0;
                  lVar87 = lVar87 + 1;
                  lVar88 = lVar88 + iVar85 / iVar79;
                  lVar89 = lVar89 + iVar80 / iVar79;
                } while (lVar87 < *(int *)(&this->field_0xb8 +
                                          (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
                bVar90 = true;
              }
            }
          }
          Mat::~Mat((Mat *)&ptr);
          piVar68 = bottom_blob_int8.refcount;
          if (!bVar90) goto LAB_0015edfc;
LAB_0015eddd:
          pLVar81 = this->activation;
        }
        else {
          Mat::create(top_blob,iVar79,iVar85,*(int *)(&this->field_0x80 + (long)p_Var3),4,
                      local_170->blob_allocator);
          iVar77 = -100;
          piVar68 = bottom_blob_int8.refcount;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_0015edfc;
          p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
          iVar79 = *(int *)(&this->field_0xb8 + (long)p_Var3);
          if ((iVar80 != iVar79) || (iVar79 != *(int *)(&this->field_0x80 + (long)p_Var3))) {
            iVar85 = *(int *)(&this->field_0x80 + (long)p_Var3) / iVar79;
            if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
              lVar87 = 0;
              lVar88 = 0;
              lVar89 = 0;
              do {
                pAStack_1a8 = (Allocator *)
                              CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                       (undefined4)bottom_blob_int8.elemsize);
                ptr = (void *)(bottom_blob_int8.cstep * lVar87 * (long)pAStack_1a8 +
                              (long)bottom_blob_int8.data);
                uStack_1b0 = 0;
                uStack_1ac = 0;
                local_1a0 = bottom_blob_int8.elempack;
                local_198 = bottom_blob_int8.allocator;
                iStack_190 = 3;
                iStack_18c = bottom_blob_int8.w;
                iStack_188 = bottom_blob_int8.h;
                sStack_180 = ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * (long)pAStack_1a8 +
                              0xfU & 0xfffffffffffffff0) / (ulong)pAStack_1a8;
                bottom_blob_int8_g.elemsize = top_blob->elemsize;
                bottom_blob_int8_g.data =
                     (void *)(top_blob->cstep * lVar88 * bottom_blob_int8_g.elemsize +
                             (long)top_blob->data);
                bottom_blob_int8_g.elempack = top_blob->elempack;
                bottom_blob_int8_g.allocator = top_blob->allocator;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.w = top_blob->w;
                bottom_blob_int8_g.dims = 3;
                bottom_blob_int8_g.h = top_blob->h;
                bottom_blob_int8_g.c = iVar85;
                bottom_blob_int8_g.cstep =
                     ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
                     0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
                pLVar81 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar89];
                uVar22._0_1_ = local_170->lightmode;
                uVar22._1_3_ = *(undefined3 *)&local_170->field_0x1;
                uVar22._4_4_ = local_170->num_threads;
                opt_g.workspace_allocator = local_170->workspace_allocator;
                uVar23._0_1_ = local_170->use_winograd_convolution;
                uVar23._1_1_ = local_170->use_sgemm_convolution;
                uVar23._2_1_ = local_170->use_int8_inference;
                uVar23._3_1_ = local_170->use_vulkan_compute;
                uVar24 = local_170->use_fp16_packed;
                uVar25 = local_170->use_fp16_storage;
                uVar27 = local_170->use_fp16_arithmetic;
                uVar29 = local_170->use_int8_storage;
                uVar28 = CONCAT11(uVar29,uVar27);
                uVar26 = CONCAT21(uVar28,uVar25);
                uVar23._4_4_ = CONCAT31(uVar26,uVar24);
                opt_g._0_4_ = SUB84(uVar22,0);
                opt_g.use_int8_arithmetic = local_170->use_int8_arithmetic;
                opt_g.use_packing_layout = local_170->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&local_170->field_0x22;
                opt_g._24_4_ = SUB84(uVar23,0);
                opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8_g.allocator,0);
                opt_g.blob_allocator._4_4_ =
                     (undefined4)((ulong)bottom_blob_int8_g.allocator >> 0x20);
                iStack_184 = iVar80 / iVar79;
                opt_g.num_threads = uVar22._4_4_;
                opt_g._28_4_ = uVar23._4_4_;
                (*pLVar81->_vptr_Layer[7])(pLVar81,&ptr,&bottom_blob_int8_g,&opt_g);
                piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                          bottom_blob_int8_g.refcount._0_4_);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                      if (bottom_blob_int8_g.data != (void *)0x0) {
                        free(bottom_blob_int8_g.data);
                      }
                    }
                    else {
                      (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                bottom_blob_int8_g.elemsize = 0;
                bottom_blob_int8_g.elempack = 0;
                bottom_blob_int8_g.data = (void *)0x0;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.dims = 0;
                bottom_blob_int8_g.w = 0;
                bottom_blob_int8_g.h = 0;
                bottom_blob_int8_g.c = 0;
                bottom_blob_int8_g.cstep = 0;
                piVar68 = (int *)CONCAT44(uStack_1ac,uStack_1b0);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (local_198 == (Allocator *)0x0) {
                      if (ptr != (void *)0x0) {
                        free(ptr);
                      }
                    }
                    else {
                      (*local_198->_vptr_Allocator[3])();
                    }
                  }
                }
                pAStack_1a8 = (Allocator *)0x0;
                local_1a0 = 0;
                ptr = (void *)0x0;
                uStack_1b0 = 0;
                uStack_1ac = 0;
                iStack_190 = 0;
                iStack_18c = 0;
                iStack_188 = 0;
                iStack_184 = 0;
                sStack_180 = 0;
                lVar89 = lVar89 + 1;
                lVar88 = lVar88 + iVar85;
                lVar87 = lVar87 + iVar80 / iVar79;
              } while (lVar89 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            goto LAB_0015eddd;
          }
          if ((((*(int *)(&this->field_0x84 + (long)p_Var3) != 3) ||
               (*(int *)(&this->field_0x88 + (long)p_Var3) != 3)) ||
              (*(int *)(&this->field_0x8c + (long)p_Var3) != 1)) ||
             ((*(int *)(&this->field_0x90 + (long)p_Var3) != 1 ||
              (((iVar80 = *(int *)(&this->field_0x94 + (long)p_Var3), iVar80 != 1 ||
                (*(int *)(&this->field_0x98 + (long)p_Var3) != 1)) &&
               ((iVar80 != 2 || (*(int *)(&this->field_0x98 + (long)p_Var3) != 2)))))))) {
            if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
              lVar87 = 0;
              do {
                pAStack_1a8 = (Allocator *)
                              CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                       (undefined4)bottom_blob_int8.elemsize);
                ptr = (void *)(bottom_blob_int8.cstep * lVar87 * (long)pAStack_1a8 +
                              (long)bottom_blob_int8.data);
                uStack_1b0 = 0;
                uStack_1ac = 0;
                local_1a0 = bottom_blob_int8.elempack;
                local_198 = bottom_blob_int8.allocator;
                iStack_190 = 3;
                iStack_18c = bottom_blob_int8.w;
                iStack_188 = bottom_blob_int8.h;
                iStack_184 = 1;
                sStack_180 = ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * (long)pAStack_1a8 +
                              0xfU & 0xfffffffffffffff0) / (ulong)pAStack_1a8;
                bottom_blob_int8_g.elemsize = top_blob->elemsize;
                bottom_blob_int8_g.data =
                     (void *)(top_blob->cstep * lVar87 * bottom_blob_int8_g.elemsize +
                             (long)top_blob->data);
                bottom_blob_int8_g.elempack = top_blob->elempack;
                bottom_blob_int8_g.allocator = top_blob->allocator;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.w = top_blob->w;
                bottom_blob_int8_g.dims = 3;
                bottom_blob_int8_g.h = top_blob->h;
                bottom_blob_int8_g.c = 1;
                bottom_blob_int8_g.cstep =
                     ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
                     0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
                pLVar81 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar87];
                uVar38._0_1_ = local_170->lightmode;
                uVar38._1_3_ = *(undefined3 *)&local_170->field_0x1;
                uVar38._4_4_ = local_170->num_threads;
                opt_g.workspace_allocator = local_170->workspace_allocator;
                uVar39._0_1_ = local_170->use_winograd_convolution;
                uVar39._1_1_ = local_170->use_sgemm_convolution;
                uVar39._2_1_ = local_170->use_int8_inference;
                uVar39._3_1_ = local_170->use_vulkan_compute;
                uVar40 = local_170->use_fp16_packed;
                uVar41 = local_170->use_fp16_storage;
                uVar43 = local_170->use_fp16_arithmetic;
                uVar45 = local_170->use_int8_storage;
                uVar44 = CONCAT11(uVar45,uVar43);
                uVar42 = CONCAT21(uVar44,uVar41);
                uVar39._4_4_ = CONCAT31(uVar42,uVar40);
                opt_g._0_4_ = SUB84(uVar38,0);
                opt_g.use_int8_arithmetic = local_170->use_int8_arithmetic;
                opt_g.use_packing_layout = local_170->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&local_170->field_0x22;
                opt_g._24_4_ = SUB84(uVar39,0);
                opt_g.num_threads = 1;
                opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8_g.allocator,0);
                opt_g.blob_allocator._4_4_ =
                     (undefined4)((ulong)bottom_blob_int8_g.allocator >> 0x20);
                opt_g._28_4_ = uVar39._4_4_;
                (*pLVar81->_vptr_Layer[7])(pLVar81,&ptr,&bottom_blob_int8_g,&opt_g);
                piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                          bottom_blob_int8_g.refcount._0_4_);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                      if (bottom_blob_int8_g.data != (void *)0x0) {
                        free(bottom_blob_int8_g.data);
                      }
                    }
                    else {
                      (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                bottom_blob_int8_g.elemsize = 0;
                bottom_blob_int8_g.elempack = 0;
                bottom_blob_int8_g.data = (void *)0x0;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.dims = 0;
                bottom_blob_int8_g.w = 0;
                bottom_blob_int8_g.h = 0;
                bottom_blob_int8_g.c = 0;
                bottom_blob_int8_g.cstep = 0;
                piVar68 = (int *)CONCAT44(uStack_1ac,uStack_1b0);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (local_198 == (Allocator *)0x0) {
                      if (ptr != (void *)0x0) {
                        free(ptr);
                      }
                    }
                    else {
                      (*local_198->_vptr_Allocator[3])();
                    }
                  }
                }
                pAStack_1a8 = (Allocator *)0x0;
                local_1a0 = 0;
                ptr = (void *)0x0;
                uStack_1b0 = 0;
                uStack_1ac = 0;
                iStack_190 = 0;
                iStack_18c = 0;
                iStack_188 = 0;
                iStack_184 = 0;
                sStack_180 = 0;
                lVar87 = lVar87 + 1;
              } while (lVar87 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            goto LAB_0015eddd;
          }
          if ((iVar80 == 1) && (*(int *)(&this->field_0x98 + (long)p_Var3) == 1)) {
            pCVar83 = this;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_78,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x258 + (long)p_Var3))
            ;
            convdw3x3s1_int8_dequant_sse
                      (&bottom_blob_int8,top_blob,(Mat *)(&this->field_0x108 + (long)p_Var3),
                       (Mat *)(&this->field_0x148 + (long)p_Var3),&local_78,(Option *)pCVar83);
            if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              pvVar73 = &local_78;
LAB_0015f374:
              operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)(pvVar73->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else if ((iVar80 == 2) && (*(int *)(&this->field_0x98 + (long)p_Var3) == 2)) {
            pCVar83 = this;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x258 + (long)p_Var3))
            ;
            convdw3x3s2_int8_dequant_sse
                      (&bottom_blob_int8,top_blob,(Mat *)(&this->field_0x108 + (long)p_Var3),
                       (Mat *)(&this->field_0x148 + (long)p_Var3),&local_90,(Option *)pCVar83);
            if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              pvVar73 = &local_90;
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              goto LAB_0015f374;
            }
          }
          pLVar81 = this->activation;
        }
        if (pLVar81 != (Layer *)0x0) {
          (*pLVar81->_vptr_Layer[9])(pLVar81,top_blob,local_170);
        }
        iVar77 = 0;
        piVar68 = bottom_blob_int8.refcount;
      }
      else {
        Mat::create(top_blob,iVar79,iVar85,*(int *)(&this->field_0x80 + (long)p_Var3),(size_t)opt_00
                    ,local_170->blob_allocator);
        iVar77 = -100;
        piVar68 = bottom_blob_int8.refcount;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
          iVar79 = *(int *)(&this->field_0xb8 + (long)p_Var3);
          if ((iVar80 == iVar79) && (iVar79 == *(int *)(&this->field_0x80 + (long)p_Var3))) {
            if ((((*(int *)(&this->field_0x84 + (long)p_Var3) == 3) &&
                 (*(int *)(&this->field_0x88 + (long)p_Var3) == 3)) &&
                (*(int *)(&this->field_0x8c + (long)p_Var3) == 1)) &&
               (*(int *)(&this->field_0x90 + (long)p_Var3) == 1)) {
              if (*(int *)(&this->field_0x94 + (long)p_Var3) == 2) {
                if (*(int *)(&this->field_0x98 + (long)p_Var3) == 2) {
                  convdw3x3s2_sse(&bottom_blob_int8,top_blob,
                                  (Mat *)(&this->field_0x108 + (long)p_Var3),
                                  (Mat *)(&this->field_0x148 + (long)p_Var3),opt_00);
                }
              }
              else if ((*(int *)(&this->field_0x94 + (long)p_Var3) == 1) &&
                      (*(int *)(&this->field_0x98 + (long)p_Var3) == 1)) {
                convdw3x3s1_sse(&bottom_blob_int8,top_blob,
                                (Mat *)(&this->field_0x108 + (long)p_Var3),
                                (Mat *)(&this->field_0x148 + (long)p_Var3),opt_00);
              }
            }
            else if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 )) {
              lVar87 = 0;
              do {
                pAStack_1a8 = (Allocator *)
                              CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                       (undefined4)bottom_blob_int8.elemsize);
                ptr = (void *)(bottom_blob_int8.cstep * lVar87 * (long)pAStack_1a8 +
                              (long)bottom_blob_int8.data);
                uStack_1b0 = 0;
                uStack_1ac = 0;
                local_1a0 = bottom_blob_int8.elempack;
                local_198 = bottom_blob_int8.allocator;
                iStack_190 = 3;
                iStack_18c = bottom_blob_int8.w;
                iStack_188 = bottom_blob_int8.h;
                iStack_184 = 1;
                sStack_180 = ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * (long)pAStack_1a8 +
                              0xfU & 0xfffffffffffffff0) / (ulong)pAStack_1a8;
                bottom_blob_int8_g.elemsize = top_blob->elemsize;
                bottom_blob_int8_g.data =
                     (void *)(top_blob->cstep * lVar87 * bottom_blob_int8_g.elemsize +
                             (long)top_blob->data);
                bottom_blob_int8_g.elempack = top_blob->elempack;
                bottom_blob_int8_g.allocator = top_blob->allocator;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.w = top_blob->w;
                bottom_blob_int8_g.dims = 3;
                bottom_blob_int8_g.h = top_blob->h;
                bottom_blob_int8_g.c = 1;
                bottom_blob_int8_g.cstep =
                     ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
                     0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
                pLVar81 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar87];
                uVar30._0_1_ = local_170->lightmode;
                uVar30._1_3_ = *(undefined3 *)&local_170->field_0x1;
                uVar30._4_4_ = local_170->num_threads;
                opt_g.workspace_allocator = local_170->workspace_allocator;
                uVar31._0_1_ = local_170->use_winograd_convolution;
                uVar31._1_1_ = local_170->use_sgemm_convolution;
                uVar31._2_1_ = local_170->use_int8_inference;
                uVar31._3_1_ = local_170->use_vulkan_compute;
                uVar32 = local_170->use_fp16_packed;
                uVar33 = local_170->use_fp16_storage;
                uVar35 = local_170->use_fp16_arithmetic;
                uVar37 = local_170->use_int8_storage;
                uVar36 = CONCAT11(uVar37,uVar35);
                uVar34 = CONCAT21(uVar36,uVar33);
                uVar31._4_4_ = CONCAT31(uVar34,uVar32);
                opt_g._0_4_ = SUB84(uVar30,0);
                opt_g.use_int8_arithmetic = local_170->use_int8_arithmetic;
                opt_g.use_packing_layout = local_170->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&local_170->field_0x22;
                opt_g._24_4_ = SUB84(uVar31,0);
                opt_g.num_threads = 1;
                opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8_g.allocator,0);
                opt_g.blob_allocator._4_4_ =
                     (undefined4)((ulong)bottom_blob_int8_g.allocator >> 0x20);
                opt_g._28_4_ = uVar31._4_4_;
                (*pLVar81->_vptr_Layer[7])(pLVar81,&ptr,&bottom_blob_int8_g,&opt_g);
                piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                          bottom_blob_int8_g.refcount._0_4_);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                      if (bottom_blob_int8_g.data != (void *)0x0) {
                        free(bottom_blob_int8_g.data);
                      }
                    }
                    else {
                      (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                bottom_blob_int8_g.elemsize = 0;
                bottom_blob_int8_g.elempack = 0;
                bottom_blob_int8_g.data = (void *)0x0;
                bottom_blob_int8_g.refcount._0_4_ = 0;
                bottom_blob_int8_g.refcount._4_4_ = 0;
                bottom_blob_int8_g.dims = 0;
                bottom_blob_int8_g.w = 0;
                bottom_blob_int8_g.h = 0;
                bottom_blob_int8_g.c = 0;
                bottom_blob_int8_g.cstep = 0;
                piVar68 = (int *)CONCAT44(uStack_1ac,uStack_1b0);
                if (piVar68 != (int *)0x0) {
                  LOCK();
                  *piVar68 = *piVar68 + -1;
                  UNLOCK();
                  if (*piVar68 == 0) {
                    if (local_198 == (Allocator *)0x0) {
                      if (ptr != (void *)0x0) {
                        free(ptr);
                      }
                    }
                    else {
                      (*local_198->_vptr_Allocator[3])();
                    }
                  }
                }
                pAStack_1a8 = (Allocator *)0x0;
                local_1a0 = 0;
                ptr = (void *)0x0;
                uStack_1b0 = 0;
                uStack_1ac = 0;
                iStack_190 = 0;
                iStack_18c = 0;
                iStack_188 = 0;
                iStack_184 = 0;
                sStack_180 = 0;
                lVar87 = lVar87 + 1;
              } while (lVar87 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            goto LAB_0015eddd;
          }
          iVar85 = *(int *)(&this->field_0x80 + (long)p_Var3) / iVar79;
          if (0 < *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar89 = 0;
            lVar87 = 0;
            lVar88 = 0;
            do {
              pAStack_1a8 = (Allocator *)
                            CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                     (undefined4)bottom_blob_int8.elemsize);
              ptr = (void *)(bottom_blob_int8.cstep * lVar89 * (long)pAStack_1a8 +
                            (long)bottom_blob_int8.data);
              uStack_1b0 = 0;
              uStack_1ac = 0;
              local_1a0 = bottom_blob_int8.elempack;
              local_198 = bottom_blob_int8.allocator;
              iStack_190 = 3;
              iStack_18c = bottom_blob_int8.w;
              iStack_188 = bottom_blob_int8.h;
              sStack_180 = ((long)(bottom_blob_int8.h * bottom_blob_int8.w) * (long)pAStack_1a8 +
                            0xfU & 0xfffffffffffffff0) / (ulong)pAStack_1a8;
              bottom_blob_int8_g.elemsize = top_blob->elemsize;
              bottom_blob_int8_g.data =
                   (void *)(top_blob->cstep * lVar87 * bottom_blob_int8_g.elemsize +
                           (long)top_blob->data);
              bottom_blob_int8_g.elempack = top_blob->elempack;
              bottom_blob_int8_g.allocator = top_blob->allocator;
              bottom_blob_int8_g.refcount._0_4_ = 0;
              bottom_blob_int8_g.refcount._4_4_ = 0;
              bottom_blob_int8_g.w = top_blob->w;
              bottom_blob_int8_g.dims = 3;
              bottom_blob_int8_g.h = top_blob->h;
              bottom_blob_int8_g.c = iVar85;
              bottom_blob_int8_g.cstep =
                   ((long)(top_blob->h * top_blob->w) * bottom_blob_int8_g.elemsize + 0xf &
                   0xfffffffffffffff0) / bottom_blob_int8_g.elemsize;
              pLVar81 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar88];
              uVar14._0_1_ = local_170->lightmode;
              uVar14._1_3_ = *(undefined3 *)&local_170->field_0x1;
              uVar14._4_4_ = local_170->num_threads;
              opt_g.workspace_allocator = local_170->workspace_allocator;
              uVar15._0_1_ = local_170->use_winograd_convolution;
              uVar15._1_1_ = local_170->use_sgemm_convolution;
              uVar15._2_1_ = local_170->use_int8_inference;
              uVar15._3_1_ = local_170->use_vulkan_compute;
              uVar16 = local_170->use_fp16_packed;
              uVar17 = local_170->use_fp16_storage;
              uVar19 = local_170->use_fp16_arithmetic;
              uVar21 = local_170->use_int8_storage;
              uVar20 = CONCAT11(uVar21,uVar19);
              uVar18 = CONCAT21(uVar20,uVar17);
              uVar15._4_4_ = CONCAT31(uVar18,uVar16);
              opt_g._0_4_ = SUB84(uVar14,0);
              opt_g.use_int8_arithmetic = local_170->use_int8_arithmetic;
              opt_g.use_packing_layout = local_170->use_packing_layout;
              opt_g._34_6_ = *(undefined6 *)&local_170->field_0x22;
              opt_g._24_4_ = SUB84(uVar15,0);
              opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8_g.allocator,0);
              opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8_g.allocator >> 0x20)
              ;
              iStack_184 = iVar80 / iVar79;
              opt_g.num_threads = uVar14._4_4_;
              opt_g._28_4_ = uVar15._4_4_;
              (*pLVar81->_vptr_Layer[7])(pLVar81,&ptr,&bottom_blob_int8_g,&opt_g);
              piVar68 = (int *)CONCAT44(bottom_blob_int8_g.refcount._4_4_,
                                        bottom_blob_int8_g.refcount._0_4_);
              if (piVar68 != (int *)0x0) {
                LOCK();
                *piVar68 = *piVar68 + -1;
                UNLOCK();
                if (*piVar68 == 0) {
                  if (bottom_blob_int8_g.allocator == (Allocator *)0x0) {
                    if (bottom_blob_int8_g.data != (void *)0x0) {
                      free(bottom_blob_int8_g.data);
                    }
                  }
                  else {
                    (*(bottom_blob_int8_g.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              bottom_blob_int8_g.elemsize = 0;
              bottom_blob_int8_g.elempack = 0;
              bottom_blob_int8_g.data = (void *)0x0;
              bottom_blob_int8_g.refcount._0_4_ = 0;
              bottom_blob_int8_g.refcount._4_4_ = 0;
              bottom_blob_int8_g.dims = 0;
              bottom_blob_int8_g.w = 0;
              bottom_blob_int8_g.h = 0;
              bottom_blob_int8_g.c = 0;
              bottom_blob_int8_g.cstep = 0;
              piVar68 = (int *)CONCAT44(uStack_1ac,uStack_1b0);
              if (piVar68 != (int *)0x0) {
                LOCK();
                *piVar68 = *piVar68 + -1;
                UNLOCK();
                if (*piVar68 == 0) {
                  if (local_198 == (Allocator *)0x0) {
                    if (ptr != (void *)0x0) {
                      free(ptr);
                    }
                  }
                  else {
                    (*local_198->_vptr_Allocator[3])();
                  }
                }
              }
              pAStack_1a8 = (Allocator *)0x0;
              local_1a0 = 0;
              ptr = (void *)0x0;
              uStack_1b0 = 0;
              uStack_1ac = 0;
              iStack_190 = 0;
              iStack_18c = 0;
              iStack_188 = 0;
              iStack_184 = 0;
              sStack_180 = 0;
              lVar88 = lVar88 + 1;
              lVar87 = lVar87 + iVar85;
              lVar89 = lVar89 + iVar80 / iVar79;
            } while (lVar88 < *(int *)(&this->field_0xb8 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          pLVar81 = this->activation;
          iVar77 = 0;
          piVar68 = bottom_blob_int8.refcount;
          if (pLVar81 != (Layer *)0x0) {
            (*pLVar81->_vptr_Layer[9])(pLVar81,top_blob,local_170);
            piVar68 = bottom_blob_int8.refcount;
          }
        }
      }
    }
  }
  else {
    local_198 = *(Allocator **)&opt->use_int8_arithmetic;
    ptr = *(void **)opt;
    pAStack_1a8 = opt->workspace_allocator;
    uVar47._0_1_ = opt->use_winograd_convolution;
    uVar47._1_1_ = opt->use_sgemm_convolution;
    uVar47._2_1_ = opt->use_int8_inference;
    uVar47._3_1_ = opt->use_vulkan_compute;
    uVar48 = opt->use_fp16_packed;
    uVar49 = opt->use_fp16_storage;
    uVar51 = opt->use_fp16_arithmetic;
    uVar53 = opt->use_int8_storage;
    uVar52 = CONCAT11(uVar53,uVar51);
    uVar50 = CONCAT21(uVar52,uVar49);
    uVar47._4_4_ = CONCAT31(uVar50,uVar48);
    local_1a0 = (int)uVar47;
    uStack_1b0 = SUB84(opt->workspace_allocator,0);
    uStack_1ac = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var3 = pp_Var4[-3];
    uStack_19c = uVar47._4_4_;
    copy_make_border((Mat *)local_118,&bottom_blob_int8,*(int *)(&this->field_0xa4 + (long)p_Var3),
                     *(int *)(&this->field_0xa8 + (long)p_Var3),
                     *(int *)(&this->field_0x9c + (long)p_Var3),
                     *(int *)(&this->field_0xa0 + (long)p_Var3),0,
                     *(float *)(&this->field_0xac + (long)p_Var3),(Option *)&ptr);
    if (bottom_blob_int8.data == (void *)0x0) {
      bVar90 = true;
    }
    else {
      bVar90 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    }
    if (!bVar90) {
      iVar79 = bottom_blob_int8.w;
      iVar85 = bottom_blob_int8.h;
    }
    iVar77 = -100;
    piVar68 = bottom_blob_int8.refcount;
    if (!bVar90) goto LAB_0015db6c;
  }
LAB_0015edfc:
  if (piVar68 != (int *)0x0) {
    LOCK();
    *piVar68 = *piVar68 + -1;
    UNLOCK();
    if (*piVar68 == 0) {
      bottom_blob_int8.refcount = piVar68;
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        if (bottom_blob_int8.data != (void *)0x0) {
          free(bottom_blob_int8.data);
        }
      }
      else {
        (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0015ee5c:
  bottom_blob_int8.cstep = 0;
  bottom_blob_int8.dims = 0;
  bottom_blob_int8.w = 0;
  bottom_blob_int8.h = 0;
  bottom_blob_int8.c = 0;
  bottom_blob_int8.elempack = 0;
  bottom_blob_int8.elemsize._4_4_ = 0;
  bottom_blob_int8.elemsize._0_4_ = 0;
  bottom_blob_int8.refcount._4_4_ = 0;
  bottom_blob_int8.refcount._0_4_ = 0;
  bottom_blob_int8.data = (void *)0x0;
  if ((int *)local_118._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_118._8_8_ == 0) {
      if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
        if ((void *)local_118._0_8_ != (void *)0x0) {
          free((void *)local_118._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_118._32_8_)[3])();
      }
    }
  }
  return iVar77;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;       
    }     

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                          
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                           
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_tm_g = top_blob_tm.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                

                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_tm_g = top_blob_tm.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
            }                 
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);                          
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }                        

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_g = top_blob.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                
              
                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
            }                       
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }          

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;
    
    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if (stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }
            else if (stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

         // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}